

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

Iterator *
testing::internal::
CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<std::tuple<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int),unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int)>>::Iterator_const,testing::internal::ParamIteratorInterface<std::tuple<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int),unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int)>>const>
          (ParamIteratorInterface<std::tuple<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int),_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int)>_>
           *base)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  undefined8 uVar4;
  GTestLog local_c;
  
  if (base != (ParamIteratorInterface<std::tuple<unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int),_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int,_const_unsigned_char_*,_const_unsigned_char_*,_int,_int)>_>
               *)0x0) {
    __s1 = *(char **)(base->_vptr_ParamIteratorInterface[-1] + 8);
    if (__s1 == 
        "N7testing8internal30ValuesInIteratorRangeGeneratorISt5tupleIJPFjPKhiS4_iS4_S4_iiES6_EEE8IteratorE"
       ) {
      bVar1 = true;
    }
    else if (*__s1 == '*') {
      bVar1 = false;
    }
    else {
      iVar2 = strcmp(__s1,
                     "N7testing8internal30ValuesInIteratorRangeGeneratorISt5tupleIJPFjPKhiS4_iS4_S4_iiES6_EEE8IteratorE"
                    );
      bVar1 = iVar2 == 0;
    }
    bVar1 = IsTrue(bVar1);
    if (!bVar1) {
      GTestLog::GTestLog(&local_c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                         ,0x45e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
      GTestLog::~GTestLog(&local_c);
    }
    pIVar3 = (Iterator *)
             __dynamic_cast(base,&ParamIteratorInterface<std::tuple<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int),unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int)>>
                                  ::typeinfo,
                            &ValuesInIteratorRangeGenerator<std::tuple<unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int),unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int,unsigned_char_const*,unsigned_char_const*,int,int)>>
                             ::Iterator::typeinfo,0);
    return pIVar3;
  }
  uVar4 = __cxa_bad_typeid();
  GTestLog::~GTestLog(&local_c);
  _Unwind_Resume(uVar4);
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}